

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BumpAllocator.h
# Opt level: O1

DelayedSequenceElementSyntax * __thiscall
slang::BumpAllocator::
emplace<slang::syntax::DelayedSequenceElementSyntax,slang::parsing::Token&,slang::syntax::ExpressionSyntax*&,slang::parsing::Token&,slang::parsing::Token&,slang::syntax::SelectorSyntax*&,slang::parsing::Token&,slang::syntax::SequenceExprSyntax&>
          (BumpAllocator *this,Token *args,ExpressionSyntax **args_1,Token *args_2,Token *args_3,
          SelectorSyntax **args_4,Token *args_5,SequenceExprSyntax *args_6)

{
  ExpressionSyntax *pEVar1;
  SelectorSyntax *pSVar2;
  Info *pIVar3;
  Info *pIVar4;
  Info *pIVar5;
  Info *pIVar6;
  TokenKind TVar7;
  undefined1 uVar8;
  NumericTokenFlags NVar9;
  uint32_t uVar10;
  TokenKind TVar11;
  undefined1 uVar12;
  NumericTokenFlags NVar13;
  uint32_t uVar14;
  TokenKind TVar15;
  undefined1 uVar16;
  NumericTokenFlags NVar17;
  uint32_t uVar18;
  TokenKind TVar19;
  undefined1 uVar20;
  NumericTokenFlags NVar21;
  uint32_t uVar22;
  DelayedSequenceElementSyntax *pDVar23;
  
  pDVar23 = (DelayedSequenceElementSyntax *)((ulong)(this->head->current + 7) & 0xfffffffffffffff8);
  if ((DelayedSequenceElementSyntax *)this->endPtr < pDVar23 + 1) {
    pDVar23 = (DelayedSequenceElementSyntax *)allocateSlow(this,0x70,8);
  }
  else {
    this->head->current = (byte *)(pDVar23 + 1);
  }
  TVar7 = args->kind;
  uVar8 = args->field_0x2;
  NVar9.raw = (args->numFlags).raw;
  uVar10 = args->rawLen;
  pIVar3 = args->info;
  pEVar1 = *args_1;
  TVar11 = args_2->kind;
  uVar12 = args_2->field_0x2;
  NVar13.raw = (args_2->numFlags).raw;
  uVar14 = args_2->rawLen;
  pIVar4 = args_2->info;
  TVar15 = args_3->kind;
  uVar16 = args_3->field_0x2;
  NVar17.raw = (args_3->numFlags).raw;
  uVar18 = args_3->rawLen;
  pIVar5 = args_3->info;
  pSVar2 = *args_4;
  TVar19 = args_5->kind;
  uVar20 = args_5->field_0x2;
  NVar21.raw = (args_5->numFlags).raw;
  uVar22 = args_5->rawLen;
  pIVar6 = args_5->info;
  (pDVar23->super_SyntaxNode).kind = DelayedSequenceElement;
  (pDVar23->super_SyntaxNode).parent = (SyntaxNode *)0x0;
  (pDVar23->super_SyntaxNode).previewNode = (SyntaxNode *)0x0;
  (pDVar23->doubleHash).kind = TVar7;
  (pDVar23->doubleHash).field_0x2 = uVar8;
  (pDVar23->doubleHash).numFlags = (NumericTokenFlags)NVar9.raw;
  (pDVar23->doubleHash).rawLen = uVar10;
  (pDVar23->doubleHash).info = pIVar3;
  pDVar23->delayVal = pEVar1;
  (pDVar23->openBracket).kind = TVar11;
  (pDVar23->openBracket).field_0x2 = uVar12;
  (pDVar23->openBracket).numFlags = (NumericTokenFlags)NVar13.raw;
  (pDVar23->openBracket).rawLen = uVar14;
  (pDVar23->openBracket).info = pIVar4;
  (pDVar23->op).kind = TVar15;
  (pDVar23->op).field_0x2 = uVar16;
  (pDVar23->op).numFlags = (NumericTokenFlags)NVar17.raw;
  (pDVar23->op).rawLen = uVar18;
  (pDVar23->op).info = pIVar5;
  pDVar23->range = pSVar2;
  (pDVar23->closeBracket).kind = TVar19;
  (pDVar23->closeBracket).field_0x2 = uVar20;
  (pDVar23->closeBracket).numFlags = (NumericTokenFlags)NVar21.raw;
  (pDVar23->closeBracket).rawLen = uVar22;
  (pDVar23->closeBracket).info = pIVar6;
  (pDVar23->expr).ptr = args_6;
  if (pEVar1 != (ExpressionSyntax *)0x0) {
    (pEVar1->super_SyntaxNode).parent = &pDVar23->super_SyntaxNode;
  }
  if (pSVar2 != (SelectorSyntax *)0x0) {
    (pSVar2->super_SyntaxNode).parent = &pDVar23->super_SyntaxNode;
  }
  (args_6->super_SyntaxNode).parent = &pDVar23->super_SyntaxNode;
  return pDVar23;
}

Assistant:

T* emplace(Args&&... args) {
        static_assert(std::is_trivially_destructible_v<T>);
        return new (allocate(sizeof(T), alignof(T))) T(std::forward<Args>(args)...);
    }